

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

void anon_unknown.dwarf_5f699::evalCtors
               (Module *wasm,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ctors,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *keptExports)

{
  int *piVar1;
  __node_base_ptr *pp_Var2;
  Module **this;
  Type *this_00;
  _Link_type other;
  pointer puVar3;
  undefined8 uVar4;
  pointer puVar5;
  Table *pTVar6;
  _func_int **pp_Var7;
  Module *pMVar8;
  pointer puVar9;
  Global *pGVar10;
  pointer puVar11;
  Memory *pMVar12;
  key_type *__k;
  pointer pLVar13;
  long *plVar14;
  key_type *__k_00;
  long lVar15;
  pointer pbVar16;
  undefined1 auVar17 [16];
  pointer pLVar18;
  pointer pLVar19;
  _Rb_tree_node_base *p_Var20;
  Builder BVar21;
  undefined8 uVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  bool bVar24;
  char cVar25;
  uint uVar26;
  Module *pMVar27;
  undefined8 *puVar28;
  undefined1 *puVar29;
  size_t *psVar30;
  Const *pCVar31;
  element_type *peVar32;
  _Rb_tree_node_base *this_01;
  _Rb_tree_node_base *p_Var33;
  mapped_type *pmVar34;
  HeapType type_00;
  mapped_type *pmVar35;
  long lVar36;
  ostream *poVar37;
  char *pcVar38;
  Function *pFVar39;
  ulong uVar40;
  Block *pBVar41;
  Literal *this_02;
  Block *pBVar42;
  LocalSet *item;
  uintptr_t uVar43;
  EvallingModuleRunner *pEVar44;
  uintptr_t *puVar45;
  size_t sVar46;
  const_iterator cVar47;
  undefined8 *puVar48;
  IString *pIVar49;
  Expression *pEVar50;
  undefined1 auVar51 [8];
  Type type_01;
  long extraout_RDX;
  _Base_ptr p_Var52;
  ulong uVar53;
  long *plVar54;
  Builder BVar55;
  _Link_type __p;
  DataDrop *pDVar56;
  _Link_type p_Var57;
  int iVar58;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import;
  pointer puVar59;
  pointer puVar60;
  pointer puVar61;
  _Rb_tree_node_base *p_Var62;
  long lVar63;
  Block *right;
  pointer puVar64;
  Name *this_03;
  MixedArena *this_04;
  uint uVar65;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  Index *this_05;
  long lVar66;
  long lVar67;
  Name name;
  string_view sVar68;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar69;
  Name NVar70;
  IString IVar71;
  Name NVar72;
  Name NVar73;
  Name NVar74;
  Name NVar75;
  Name NVar76;
  Name name_00;
  Name name_01;
  Name NVar77;
  Name NVar78;
  Name NVar79;
  Name NVar80;
  Name root;
  optional<wasm::Type> type_02;
  undefined1 local_a58 [48];
  undefined1 local_a28 [40];
  uchar auStack_a00 [8];
  undefined1 auStack_9f8 [8];
  CtorEvalExternalInterface envInterface;
  undefined1 local_8e0 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  EvallingModuleRunner instance;
  CtorEvalExternalInterface interface;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  *local_550;
  Literal local_530;
  undefined1 auStack_518 [8];
  Literals results;
  undefined1 auStack_4d8 [8];
  Literal null;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> vStack_4b8;
  bool local_4a0;
  bool local_498;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_490;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_458;
  Type local_420;
  Type type;
  undefined1 local_3f0 [8];
  Const size_1;
  bool local_3b8;
  void *local_3b0 [2];
  long local_3a0;
  char local_398;
  undefined1 local_390 [8];
  Const zero;
  void *local_350 [2];
  long local_340;
  char local_338;
  Type local_330;
  Type originalParams;
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  pointer pLStack_308;
  HeapType originalFuncType;
  undefined1 auStack_2e8 [8];
  TableInstanceInfo info;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_2c8;
  __node_base _Stack_2b0;
  char *pcStack_2a8;
  undefined1 auStack_158 [8];
  DataDrop drop;
  pointer pLStack_130;
  pointer local_128;
  undefined1 local_120 [8];
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  undefined1 auStack_d8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> localExprs;
  undefined1 auStack_b8 [8];
  Const size;
  pointer local_88;
  _Hash_node_base *local_80;
  char *pcStack_78;
  Builder local_68;
  Builder builder_1;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  key_type *local_50;
  
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_8e0,
             (keptExports->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (keptExports->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,0,&keptExportsSet._M_h._M_single_bucket,
             auStack_2e8,auStack_9f8);
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&linkedInstances;
  linkedInstances._M_t._M_impl._0_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pMVar27 = (Module *)operator_new(0x3f0);
  memset(pMVar27,0,0x3f0);
  ::wasm::Module::Module(pMVar27);
  builder_1.wasm = pMVar27;
  sVar68 = (string_view)::wasm::IString::interned(3,"env",0);
  (pMVar27->name).super_IString.str = sVar68;
  puVar64 = (wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar64 != puVar3) {
    do {
      pFVar39 = (puVar64->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar38 = (pFVar39->super_Importable).module.super_IString.str._M_str;
      if ((pcVar38 != (char *)0x0) && (pcVar38 == (pMVar27->name).super_IString.str._M_str)) {
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ &
             0xffffffffffffff00;
        info.name.super_IString.str._M_str =
             (char *)((ulong)info.name.super_IString.str._M_str & 0xffffffffffffff00);
        puVar28 = (undefined8 *)
                  ::wasm::ModuleUtils::copyFunction
                            (pFVar39,pMVar27,0,0,&keptExportsSet._M_h._M_single_bucket,auStack_2e8);
        if (((char)info.name.super_IString.str._M_str == '\x01') &&
           (info.name.super_IString.str._M_str =
                 (char *)((ulong)info.name.super_IString.str._M_str & 0xffffffffffffff00),
           auStack_2e8 != (undefined1  [8])0x0)) {
          operator_delete((void *)auStack_2e8,info.name.super_IString.str._M_len - (long)auStack_2e8
                         );
        }
        if (((char)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth ==
             '\x01') &&
           (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ =
                 instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ &
                 0xffffffffffffff00, keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0))
        {
          operator_delete(keptExportsSet._M_h._M_single_bucket,
                          (long)instance.
                                super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                                super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                                module - (long)keptExportsSet._M_h._M_single_bucket);
        }
        puVar28[5] = 0;
        puVar28[6] = 0;
        puVar28[3] = 0;
        puVar28[4] = 0;
        puVar29 = (undefined1 *)MixedArena::allocSpace(&pMVar27->allocator,0x10,8);
        *puVar29 = 0x17;
        *(undefined8 *)(puVar29 + 8) = 1;
        puVar28[0xc] = puVar29;
        uVar4 = (pFVar39->super_Importable).base.super_IString.str._M_len;
        pcVar38 = (pFVar39->super_Importable).base.super_IString.str._M_str;
        auStack_9f8 = (undefined1  [8])*puVar28;
        envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)puVar28[1];
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances
        ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)operator_new(0x30);
        *(undefined1 (*) [8])
         (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) = auStack_9f8;
        *(_func_int ***)
         (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20) =
             envInterface.super_ExternalInterface._vptr_ExternalInterface;
        *(undefined8 *)
         instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
         linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = uVar4;
        *(char **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) = pcVar38;
        *(undefined4 *)
         (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10) = 0;
        *(undefined1 *)
         (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28) = 0;
        ::wasm::Module::addExport((unique_ptr *)pMVar27);
        if (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          operator_delete((void *)instance.
                                  super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                                  .linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          0x30);
        }
      }
      puVar64 = puVar64 + 1;
    } while (puVar64 != puVar3);
  }
  puVar5 = (wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar59 = (wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; BVar55.wasm = builder_1.wasm,
      puVar59 != puVar5; puVar59 = puVar59 + 1) {
    pTVar6 = (puVar59->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar38 = (pTVar6->super_Importable).module.super_IString.str._M_str;
    if ((pcVar38 != (char *)0x0) && (pcVar38 == (pMVar27->name).super_IString.str._M_str)) {
      puVar28 = (undefined8 *)::wasm::ModuleUtils::copyTable(pTVar6,pMVar27);
      puVar28[5] = 0;
      puVar28[6] = 0;
      puVar28[3] = 0;
      puVar28[4] = 0;
      pp_Var7 = (_func_int **)(pTVar6->super_Importable).base.super_IString.str._M_len;
      pMVar8 = (Module *)(pTVar6->super_Importable).base.super_IString.str._M_str;
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)*puVar28;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           (_func_int **)puVar28[1];
      auStack_2e8 = (undefined1  [8])operator_new(0x30);
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)keptExportsSet._M_h._M_single_bucket;
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].type.id = (uintptr_t)
                    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                    _vptr_ExpressionRunner;
      (((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
       &((element_type *)auStack_2e8)->type)->
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>)._vptr_ExpressionRunner =
           pp_Var7;
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)pMVar8;
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.i32 = 1;
      *(undefined1 *)
       &(((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = 0;
      ::wasm::Module::addExport((unique_ptr *)pMVar27);
      if (auStack_2e8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_2e8,0x30);
      }
    }
  }
  puVar9 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  BVar21.wasm = builder_1.wasm;
  for (puVar60 = (wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; builder_1.wasm = BVar21.wasm,
      puVar60 != puVar9; puVar60 = puVar60 + 1) {
    pGVar10 = (puVar60->_M_t).
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    pcVar38 = (pGVar10->super_Importable).module.super_IString.str._M_str;
    if ((pcVar38 != (char *)0x0) && (pcVar38 == ((BVar55.wasm)->name).super_IString.str._M_str)) {
      psVar30 = (size_t *)::wasm::ModuleUtils::copyGlobal(pGVar10,BVar55.wasm);
      psVar30[5] = 0;
      psVar30[6] = 0;
      psVar30[3] = 0;
      psVar30[4] = 0;
      auStack_9f8 = (undefined1  [8])BVar55.wasm;
      ::wasm::Literal::makeZero((Type)&keptExportsSet._M_h._M_single_bucket);
      pp_Var2 = &keptExportsSet._M_h._M_single_bucket;
      pCVar31 = ::wasm::Builder::makeConst((Builder *)auStack_9f8,(Literal *)pp_Var2);
      psVar30[8] = (size_t)pCVar31;
      ::wasm::Literal::~Literal((Literal *)pp_Var2);
      sVar46 = (pGVar10->super_Importable).base.super_IString.str._M_len;
      pcVar38 = (pGVar10->super_Importable).base.super_IString.str._M_str;
      auStack_2e8 = (undefined1  [8])*psVar30;
      info.instance = (EvallingModuleRunner *)psVar30[1];
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances.
      _M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)operator_new(0x30);
      *(undefined1 (*) [8])
       (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances
        ._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) = auStack_2e8;
      *(EvallingModuleRunner **)
       (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances
        ._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20) = info.instance;
      *(size_t *)
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances.
       _M_t._M_impl.super__Rb_tree_header._M_node_count = sVar46;
      *(char **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) = pcVar38;
      *(undefined4 *)
       (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances
        ._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10) = 3;
      *(undefined1 *)
       (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances
        ._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28) = 0;
      ::wasm::Module::addExport((unique_ptr *)BVar55.wasm);
      if (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        operator_delete((void *)instance.
                                super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                                linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        0x30);
      }
    }
    BVar21.wasm = builder_1.wasm;
  }
  puVar11 = (wasm->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar61 = (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar61 != puVar11;
      puVar61 = puVar61 + 1) {
    pMVar12 = (puVar61->_M_t).
              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
              super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar38 = (pMVar12->super_Importable).module.super_IString.str._M_str;
    if ((pcVar38 != (char *)0x0) && (pcVar38 == ((BVar21.wasm)->name).super_IString.str._M_str)) {
      puVar28 = (undefined8 *)::wasm::ModuleUtils::copyMemory(pMVar12,BVar21.wasm);
      puVar28[5] = 0;
      puVar28[6] = 0;
      puVar28[3] = 0;
      puVar28[4] = 0;
      pp_Var7 = (_func_int **)(pMVar12->super_Importable).base.super_IString.str._M_len;
      pMVar27 = (Module *)(pMVar12->super_Importable).base.super_IString.str._M_str;
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)*puVar28;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           (_func_int **)puVar28[1];
      auStack_2e8 = (undefined1  [8])operator_new(0x30);
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)keptExportsSet._M_h._M_single_bucket;
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].type.id = (uintptr_t)
                    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                    _vptr_ExpressionRunner;
      (((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
       &((element_type *)auStack_2e8)->type)->
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>)._vptr_ExpressionRunner =
           pp_Var7;
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)pMVar27;
      (((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.i32 = 2;
      *(undefined1 *)
       &(((element_type *)auStack_2e8)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = 0;
      ::wasm::Module::addExport((unique_ptr *)BVar21.wasm);
      if (auStack_2e8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_2e8,0x30);
      }
    }
  }
  local_a28._24_8_ = local_a28 + 8;
  local_a28._16_8_ = (_Base_ptr)0x0;
  local_a28._0_8_ = 0;
  local_a28._8_8_ = (_Base_ptr)0x0;
  auStack_a00[0] = '\0';
  auStack_a00[1] = '\0';
  auStack_a00[2] = '\0';
  auStack_a00[3] = '\0';
  auStack_a00[4] = '\0';
  auStack_a00[5] = '\0';
  auStack_a00[6] = '\0';
  auStack_a00[7] = '\0';
  p_Var57 = (_Link_type)local_a28;
  local_a28._32_8_ = local_a28._24_8_;
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)auStack_9f8,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var57);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_a28._16_8_,p_Var57);
  BVar55 = builder_1;
  peVar32 = (element_type *)operator_new(0x248);
  (peVar32->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x100000001
  ;
  (peVar32->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00176b98;
  this_05 = &(peVar32->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ = &instance;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x0;
  keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm = (Module *)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_;
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)this_05,BVar55.wasm,(ExternalInterface *)auStack_9f8,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&keptExportsSet._M_h._M_single_bucket);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module,
             (_Link_type)BVar55.wasm);
  BVar55 = builder_1;
  this_03 = &(builder_1.wasm)->name;
  p_Var62 = (_Rb_tree_node_base *)&linkedInstances;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar32;
  for (p_Var52 = (_Base_ptr)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      p_Var52 != (_Rb_tree_node_base *)0x0; p_Var52 = (&p_Var52->_M_left)[bVar24]) {
    bVar24 = ::wasm::IString::operator<((IString *)(p_Var52 + 1),&this_03->super_IString);
    if (!bVar24) {
      p_Var62 = p_Var52;
    }
  }
  if ((p_Var62 != (_Rb_tree_node_base *)&linkedInstances) &&
     (bVar24 = ::wasm::IString::operator<(&this_03->super_IString,(IString *)(p_Var62 + 1)), !bVar24
     )) goto LAB_00125669;
  this_01 = (_Rb_tree_node_base *)operator_new(0x40);
  p_Var57 = (_Link_type)(this_01 + 1);
  p_Var52 = (_Base_ptr)((BVar55.wasm)->name).super_IString.str._M_str;
  *(size_t *)(this_01 + 1) = (this_03->super_IString).str._M_len;
  this_01[1]._M_parent = p_Var52;
  this_01[1]._M_left = (_Base_ptr)0x0;
  this_01[1]._M_right = (_Base_ptr)0x0;
  if (p_Var62 == (_Rb_tree_node_base *)&linkedInstances) {
    if ((linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) ||
       (__p = p_Var57,
       bVar24 = ::wasm::IString::operator<
                          ((IString *)
                           (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1
                           ),(IString *)p_Var57), !bVar24)) {
LAB_001255fa:
      __p = p_Var57;
      pVar69 = std::
               _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
               ::_M_get_insert_unique_pos
                         ((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                           *)local_120,(key_type *)p_Var57);
    }
    else {
LAB_00125611:
      auVar17._8_8_ = 0;
      auVar17._0_8_ = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar69 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar17 << 0x40);
    }
  }
  else {
    other = (_Link_type)(p_Var62 + 1);
    __p = other;
    bVar24 = ::wasm::IString::operator<((IString *)p_Var57,(IString *)other);
    if (bVar24) {
      pVar69.second = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pVar69.first = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != p_Var62) {
        p_Var33 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var62);
        __p = p_Var57;
        bVar24 = ::wasm::IString::operator<((IString *)(p_Var33 + 1),(IString *)p_Var57);
        if (!bVar24) goto LAB_001255fa;
        p_Var20 = p_Var62;
        if (p_Var33->_M_right == (_Base_ptr)0x0) {
          p_Var62 = p_Var33;
          p_Var20 = (_Rb_tree_node_base *)0x0;
        }
        pVar69.second = p_Var62;
        pVar69.first = p_Var20;
      }
    }
    else {
      __p = p_Var57;
      bVar24 = ::wasm::IString::operator<((IString *)other,(IString *)p_Var57);
      if (bVar24) {
        if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var62)
        goto LAB_00125611;
        p_Var33 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var62);
        __p = (_Link_type)(p_Var33 + 1);
        bVar24 = ::wasm::IString::operator<((IString *)p_Var57,(IString *)__p);
        if (!bVar24) goto LAB_001255fa;
        p_Var20 = p_Var33;
        if (p_Var62->_M_right == (_Base_ptr)0x0) {
          p_Var33 = p_Var62;
          p_Var20 = (_Rb_tree_node_base *)0x0;
        }
        pVar69.second = p_Var33;
        pVar69.first = p_Var20;
      }
      else {
        pVar69.second = (_Rb_tree_node_base *)0x0;
        pVar69.first = p_Var62;
      }
    }
  }
  p_Var33 = pVar69.second;
  p_Var62 = pVar69.first;
  if (p_Var33 == (_Rb_tree_node_base *)0x0) {
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
    ::_M_drop_node((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                    *)this_01,__p);
  }
  else {
    bVar24 = true;
    if ((p_Var62 == (_Rb_tree_node_base *)0x0) &&
       ((_Rb_tree_node_base *)&linkedInstances != p_Var33)) {
      bVar24 = ::wasm::IString::operator<((IString *)p_Var57,(IString *)(p_Var33 + 1));
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar24,this_01,p_Var33,(_Rb_tree_node_base *)&linkedInstances);
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((long)&(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color +
         1);
    p_Var62 = this_01;
  }
LAB_00125669:
  p_Var62[1]._M_left = (_Base_ptr)this_05;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var62[1]._M_right,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_a58,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_120);
  p_Var57 = (_Link_type)local_a58;
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var57);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_a58._16_8_,p_Var57);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Block_*>._M_engaged,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_120);
  pMVar27 = wasm;
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)&keptExportsSet._M_h._M_single_bucket,wasm,
             (ExternalInterface *)
             &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Block_*>._M_engaged);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase(local_550,(_Link_type)pMVar27);
  this = &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm;
  (*(code *)((((instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                exceptionStack.flexible.
                super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).exn.field_0.gcData.
              super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
            super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
            _M_str)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    exceptionStack.flexible.
                    super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_);
  puVar28 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x30);
  puVar48 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x38);
  if (puVar28 != puVar48) {
    do {
      __k = (key_type *)*puVar28;
      if (__k[2].super_IString.str._M_len == 0) {
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_2e8,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                   &keptExportsSet._M_h._M_single_bucket,
                   (Expression *)__k[4].super_IString.str._M_len);
        pmVar34 = std::
                  map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                  ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                                *)this,__k);
        (pmVar34->super_SmallVector<wasm::Literal,_1UL>).usedFixed = (size_t)auStack_2e8;
        ::wasm::Literal::operator=
                  ((pmVar34->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,(Literal *)&info)
        ;
        pLVar18 = (pmVar34->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar19 = (pmVar34->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pLVar13 = (pmVar34->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (pmVar34->super_SmallVector<wasm::Literal,_1UL>).flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pmVar34->super_SmallVector<wasm::Literal,_1UL>).flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pmVar34->super_SmallVector<wasm::Literal,_1UL>).flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        null.field_0._8_4_ = SUB84(pLVar13,0);
        null.field_0._12_4_ = (undefined4)((ulong)pLVar13 >> 0x20);
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_4d8._0_2_ = SUB82(pLVar18,0);
        auStack_4d8[2] = (undefined1)((ulong)pLVar18 >> 0x10);
        auStack_4d8[3] = (undefined1)((ulong)pLVar18 >> 0x18);
        auStack_4d8._4_4_ = (undefined4)((ulong)pLVar18 >> 0x20);
        null.field_0.i32 = (int32_t)pLVar19;
        null.field_0.i64._4_4_ = (undefined4)((ulong)pLVar19 >> 0x20);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_4d8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_2c8);
        ::wasm::Literal::~Literal((Literal *)&info);
      }
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar48);
  }
  (**(code **)&((((instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   exceptionStack.flexible.
                   super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).exn.field_0.gcData.
                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
               super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0)
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             exceptionStack.flexible.
             super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_);
  plVar14 = *(long **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      0xb0);
  for (plVar54 = *(long **)(instance.
                            super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                            _24_8_ + 0xa8); plVar54 != plVar14; plVar54 = plVar54 + 1) {
    uVar53 = ((IString *)*plVar54)[5].str._M_len;
    if (((uint)uVar53 & 3) == 2 && 6 < uVar53) {
      ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                ((TableInstanceInfo *)auStack_2e8,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                 &keptExportsSet._M_h._M_single_bucket,(Name)((IString *)*plVar54)->str);
      type_00 = ::wasm::Type::getHeapType((Type *)(*plVar54 + 0x50));
      ::wasm::Literal::makeNull((Literal *)auStack_4d8,type_00);
      sVar46 = info.name.super_IString.str._M_len;
      pEVar44 = info.instance;
      auVar51 = auStack_2e8;
      if (*(long *)(*plVar54 + 0x38) != 0) {
        uVar53 = 0;
        do {
          (*(*(ExternalInterface **)((long)auVar51 + 0x200))->_vptr_ExternalInterface[0x1c])
                    (*(ExternalInterface **)((long)auVar51 + 0x200),pEVar44,sVar46,uVar53,
                     auStack_4d8);
          uVar53 = uVar53 + 1;
        } while (uVar53 < *(ulong *)(*plVar54 + 0x38));
      }
      ::wasm::Literal::~Literal((Literal *)auStack_4d8);
    }
  }
  local_390[0] = '\x0e';
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  zero.value.field_0.i64 = 0;
  zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_2e8 = (undefined1  [8])((ulong)auStack_2e8 & 0xffffffff00000000);
  info.name.super_IString.str._M_len = 2;
  ::wasm::Literal::operator=
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
             (Literal *)auStack_2e8);
  ::wasm::Literal::~Literal((Literal *)auStack_2e8);
  ::wasm::Const::finalize();
  plVar54 = *(long **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      0x60);
  plVar14 = *(long **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      0x68);
  if (plVar54 != plVar14) {
    do {
      psVar30 = (size_t *)*plVar54;
      if (psVar30[4] != 0) {
        auStack_b8[0] = 0xe;
        size.value.field_0.i64 = 0;
        size.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        auStack_2e8._0_4_ = (int)(psVar30[8] - psVar30[7] >> 3);
        info.name.super_IString.str._M_len = 2;
        ::wasm::Literal::operator=
                  ((Literal *)
                   &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                   (Literal *)auStack_2e8);
        ::wasm::Literal::~Literal((Literal *)auStack_2e8);
        ::wasm::Const::finalize();
        auStack_2e8[0] = 0x33;
        info.instance = (EvallingModuleRunner *)0x0;
        _Stack_2b0._M_nxt = (_Hash_node_base *)psVar30[3];
        pcStack_2a8 = (char *)psVar30[4];
        info.name.super_IString.str._M_len = *psVar30;
        info.name.super_IString.str._M_str = (char *)psVar30[1];
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)psVar30[5];
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_390;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auStack_b8;
        ::wasm::TableInit::finalize();
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_4d8,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                   &keptExportsSet._M_h._M_single_bucket,(Expression *)auStack_2e8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&vStack_4b8);
        ::wasm::Literal::~Literal(&null);
        local_3f0 = (undefined1  [8])
                    &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     droppedDataSegments._M_h._M_single_bucket;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_3f0,psVar30,local_3f0);
        ::wasm::Literal::~Literal
                  ((Literal *)
                   &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
      }
      plVar54 = plVar54 + 1;
    } while (plVar54 != plVar14);
  }
  ::wasm::Literal::~Literal
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
  puVar28 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x78);
  puVar48 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x80);
  if (puVar28 != puVar48) {
    do {
      __k_00 = (key_type *)*puVar28;
      pmVar35 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&instance.
                                 super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                                 .droppedElementSegments._M_h._M_single_bucket,__k_00);
      pmVar35->addr = (address64_t)__k_00[3].super_IString.str._M_str;
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar48);
  }
  lVar66 = *(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                    0x98) -
           *(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                    0x90);
  if (lVar66 != 0) {
    lVar66 = lVar66 >> 3;
    lVar63 = 0;
    do {
      lVar67 = *(long *)(instance.
                         super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_
                        + 0x90);
      lVar15 = *(long *)(lVar67 + lVar63 * 8);
      if (*(char *)(lVar15 + 0x28) == '\0') {
        NVar70.super_IString.str._M_str = *(char **)(lVar15 + 0x18);
        NVar70.super_IString.str._M_len._0_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
        NVar70.super_IString.str._M_len._4_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
        lVar36 = ::wasm::Module::getMemory(NVar70);
        local_390[0] = '\x0e';
        zero.value.field_0.i64 = 0;
        zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        ::wasm::Literal::makeFromInt32((Literal *)auStack_2e8,0,(Type)*(uintptr_t *)(lVar36 + 0x50))
        ;
        ::wasm::Literal::operator=
                  ((Literal *)
                   &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                   (Literal *)auStack_2e8);
        ::wasm::Literal::~Literal((Literal *)auStack_2e8);
        ::wasm::Const::finalize();
        local_3f0[0] = 0xe;
        size_1.value.field_0.i64 = 0;
        size_1.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        lVar15 = *(long *)(lVar67 + lVar63 * 8);
        ::wasm::Literal::makeFromInt32
                  ((Literal *)auStack_2e8,*(int *)(lVar15 + 0x40) - *(int *)(lVar15 + 0x38),
                   (Type)*(uintptr_t *)(lVar36 + 0x50));
        this_00 = &size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
        ::wasm::Literal::operator=((Literal *)this_00,(Literal *)auStack_2e8);
        ::wasm::Literal::~Literal((Literal *)auStack_2e8);
        ::wasm::Const::finalize();
        auStack_2e8[0] = 0x24;
        info.instance = (EvallingModuleRunner *)0x0;
        lVar15 = *(long *)(lVar67 + lVar63 * 8);
        _Stack_2b0._M_nxt = *(_Hash_node_base **)(lVar15 + 0x18);
        pcStack_2a8 = *(char **)(lVar15 + 0x20);
        psVar30 = *(size_t **)(lVar67 + lVar63 * 8);
        info.name.super_IString.str._M_len = *psVar30;
        info.name.super_IString.str._M_str = (char *)psVar30[1];
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(*(long *)(lVar67 + lVar63 * 8) + 0x30);
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_390;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_3f0;
        ::wasm::MemoryInit::finalize();
        auStack_158[0] = 0x25;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
        puVar45 = *(uintptr_t **)(lVar67 + lVar63 * 8);
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id = *puVar45;
        drop.segment.super_IString.str._M_len = puVar45[1];
        ::wasm::DataDrop::finalize();
        pp_Var2 = &keptExportsSet._M_h._M_single_bucket;
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_4d8,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)pp_Var2,
                   (Expression *)auStack_2e8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&vStack_4b8);
        ::wasm::Literal::~Literal(&null);
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_b8,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)pp_Var2,
                   (Expression *)auStack_158);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &size.value.field_0.func.super_IString.str._M_str);
        ::wasm::Literal::~Literal((Literal *)&size);
        ::wasm::Literal::~Literal((Literal *)this_00);
        ::wasm::Literal::~Literal
                  ((Literal *)
                   &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
      }
      lVar63 = lVar63 + 1;
    } while (lVar66 + (ulong)(lVar66 == 0) != lVar63);
  }
  pcVar38 = *(char **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      200);
  if (pcVar38 != (char *)0x0) {
    local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.name.super_IString.str._M_len = 0;
    info.name.super_IString.str._M_str = (char *)0x0;
    auStack_2e8 = (undefined1  [8])0x0;
    info.instance = (EvallingModuleRunner *)0x0;
    local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar46 = *(size_t *)
              (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0xc0);
    ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_b8,
               (SmallVector<wasm::Literal,_1UL> *)auStack_2e8);
    name.super_IString.str._M_str = pcVar38;
    name.super_IString.str._M_len = sVar46;
    ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
              ((Literals *)auStack_4d8,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               &keptExportsSet._M_h._M_single_bucket,name,(Literals *)auStack_b8);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&vStack_4b8);
    ::wasm::Literal::~Literal(&null);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &size.value.field_0.func.super_IString.str._M_str);
    ::wasm::Literal::~Literal((Literal *)&size);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_2c8);
    ::wasm::Literal::~Literal((Literal *)&info);
  }
  interface.usedGlobalNames._M_h._M_single_bucket._0_1_ = 1;
  local_50 = (ctors->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = (ctors->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (local_50 == pbVar16) {
LAB_00127050:
    ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::~ModuleRunnerBase
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               &keptExportsSet._M_h._M_single_bucket);
    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances.
    _M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&PTR__CtorEvalExternalInterface_00176980;
    while ((undefined8 *)interface.definingGlobals._M_h._M_bucket_count != (undefined8 *)0x0) {
      puVar28 = *(undefined8 **)interface.definingGlobals._M_h._M_bucket_count;
      operator_delete((void *)interface.definingGlobals._M_h._M_bucket_count,0x28);
      interface.definingGlobals._M_h._M_bucket_count = (size_type)puVar28;
    }
    p_Var57 = (_Link_type)0x0;
    memset((void *)interface.MaximumMemory,0,(long)interface.definingGlobals._M_h._M_buckets << 3);
    interface.definingGlobals._M_h._M_bucket_count = 0;
    interface.definingGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (&interface.definingGlobals._M_h._M_rehash_policy._M_next_resize !=
        (size_t *)interface.MaximumMemory) {
      p_Var57 = (_Link_type)((long)interface.definingGlobals._M_h._M_buckets << 3);
      operator_delete((void *)interface.MaximumMemory,(ulong)p_Var57);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&interface.memories._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
    ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                *)interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
               p_Var57);
    if (envInstance.
        super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 envInstance.
                 super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    auStack_9f8 = (undefined1  [8])&PTR__CtorEvalExternalInterface_00176980;
    while ((undefined8 *)envInterface.definingGlobals._M_h._M_bucket_count != (undefined8 *)0x0) {
      puVar28 = *(undefined8 **)envInterface.definingGlobals._M_h._M_bucket_count;
      operator_delete((void *)envInterface.definingGlobals._M_h._M_bucket_count,0x28);
      envInterface.definingGlobals._M_h._M_bucket_count = (size_type)puVar28;
    }
    p_Var57 = (_Link_type)0x0;
    memset((void *)envInterface.MaximumMemory,0,
           (long)envInterface.definingGlobals._M_h._M_buckets << 3);
    envInterface.definingGlobals._M_h._M_bucket_count = 0;
    envInterface.definingGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (&envInterface.definingGlobals._M_h._M_rehash_policy._M_next_resize !=
        (size_t *)envInterface.MaximumMemory) {
      p_Var57 = (_Link_type)((long)envInterface.definingGlobals._M_h._M_buckets << 3);
      operator_delete((void *)envInterface.MaximumMemory,(ulong)p_Var57);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&envInterface.memories._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
    ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                *)envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
               p_Var57);
    std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
              ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&builder_1);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
    ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,p_Var57);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_8e0);
    return;
  }
LAB_00125de6:
  if ((anonymous_namespace)::quiet == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"trying to eval ",0xf);
    poVar37 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(local_50->_M_dataplus)._M_p,
                         local_50->_M_string_length);
    auStack_2e8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar37,auStack_2e8,1);
  }
  pcVar38 = (char *)::wasm::IString::interned
                              (local_50->_M_string_length,(local_50->_M_dataplus)._M_p,0);
  NVar72.super_IString.str._M_str = pcVar38;
  NVar72.super_IString.str._M_len = (size_t)wasm;
  lVar66 = ::wasm::Module::getExportOrNull(NVar72);
  if ((lVar66 == 0) || (*(int *)(lVar66 + 0x10) != 0)) {
    ::wasm::Fatal::Fatal((Fatal *)auStack_2e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&info.name,"export not found: ",0x12);
    ::wasm::Fatal::operator<<((Fatal *)auStack_2e8,local_50);
    ::wasm::Fatal::~Fatal((Fatal *)auStack_2e8);
  }
  puVar28 = (undefined8 *)(lVar66 + 0x18);
  if (*(char *)(lVar66 + 0x28) != '\0') {
    puVar28 = (undefined8 *)0x0;
  }
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = puVar28[1];
  type.id = ::wasm::IString::interned(local_50->_M_string_length,(local_50->_M_dataplus)._M_p,0);
  uVar4 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
  NVar73.super_IString.str._M_str =
       (char *)envInstance.
               super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  NVar73.super_IString.str._M_len._0_4_ =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
  NVar73.super_IString.str._M_len._4_4_ =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
  pFVar39 = (Function *)::wasm::Module::getFunction(NVar73);
  if ((pFVar39->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    lVar66 = ::wasm::Function::getNumParams();
    if ((lVar66 != 0) && ((anonymous_namespace)::ignoreExternalInput == '\0')) {
      if ((anonymous_namespace)::quiet == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  ...stopping due to params\n",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n       recommendation: consider --ignore-external-input"
                   ,0x38);
      }
      goto LAB_00126e00;
    }
    drop.segment.super_IString.str._M_str = (char *)0x0;
    pLStack_130 = (pointer)0x0;
    drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id = 0;
    drop.segment.super_IString.str._M_len = 0;
    auStack_158 = (undefined1  [8])0x0;
    drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
    drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
    local_128 = (pointer)0x0;
    uVar53 = 0;
    do {
      uVar40 = ::wasm::Function::getNumParams();
      if (uVar40 <= uVar53) {
        auStack_d8 = (undefined1  [8])0x0;
        localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        goto LAB_001260f2;
      }
      auStack_2e8 = (undefined1  [8])::wasm::Function::getLocalType((uint)pFVar39);
      cVar25 = ::wasm::Type::isDefaultable();
      if (cVar25 == '\0') {
        if ((anonymous_namespace)::quiet == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ...stopping due to non-zeroable param\n",0x28);
        }
        local_3b8 = false;
      }
      else {
        ::wasm::Literal::makeZero((Type)auStack_2e8);
        ::wasm::SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_158,(Literal *)auStack_2e8);
        ::wasm::Literal::~Literal((Literal *)auStack_2e8);
      }
      uVar53 = (ulong)((int)uVar53 + 1);
    } while (cVar25 != '\0');
    goto LAB_00126dad;
  }
  if ((anonymous_namespace)::quiet == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  ...stopping since could not eval: call import: ",0x31);
    pcVar38 = (pFVar39->super_Importable).module.super_IString.str._M_str;
    auStack_2e8 = (undefined1  [8])&info.name;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_2e8,pcVar38,
               pcVar38 + (pFVar39->super_Importable).module.super_IString.str._M_len);
    poVar37 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)auStack_2e8,(long)info.instance);
    std::__ostream_insert<char,std::char_traits<char>>(poVar37,".",1);
    pcVar38 = (pFVar39->super_Importable).base.super_IString.str._M_str;
    auStack_b8 = (undefined1  [8])
                 &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_b8,pcVar38,
               pcVar38 + (pFVar39->super_Importable).base.super_IString.str._M_len);
    poVar37 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar37,(char *)auStack_b8,
                         size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                         _0_8_);
    local_390[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar37,local_390,1);
    if (auStack_b8 !=
        (undefined1  [8])
        &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type) {
      operator_delete((void *)auStack_b8,
                      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.
                      id + 1);
    }
    if (auStack_2e8 != (undefined1  [8])&info.name) {
      operator_delete((void *)auStack_2e8,info.name.super_IString.str._M_len + 1);
    }
  }
LAB_00126e00:
  local_3b8 = false;
  goto LAB_00126e07;
LAB_001260f2:
  do {
    local_68.wasm = (Module *)uVar4;
    pBVar42 = (Block *)pFVar39->body;
    if (pBVar42 == (Block *)0x0) {
      pBVar41 = (Block *)0x0;
    }
    else {
      pBVar41 = (Block *)0x0;
      if ((pBVar42->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
          BlockId) {
        pBVar41 = pBVar42;
      }
    }
    if (pBVar41 == (Block *)0x0) {
      pBVar41 = ::wasm::Builder::makeBlock(&local_68,(Expression *)pBVar42);
    }
    ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
    FunctionScope((FunctionScope *)local_390,pFVar39,(Literals *)auStack_158,
                  (EvallingModuleRunner *)&keptExportsSet._M_h._M_single_bucket);
    results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    results.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
    _M_str = (char *)0x0;
    auStack_518 = (undefined1  [8])0x0;
    results.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    results.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar46 = (pBVar41->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    iVar58 = 8;
    if (sVar46 == 0) {
      uVar26 = 0;
    }
    else {
      uVar26 = 0;
      uVar53 = 0;
      do {
        pLVar18 = local_128;
        pLVar13 = pLStack_130;
        if ((pBVar41->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar53) goto LAB_001271b7;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _Stack_2b0._M_nxt = (_Hash_node_base *)0x0;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.name.super_IString.str._M_len = 0;
        info.name.super_IString.str._M_str = (char *)0x0;
        auStack_2e8 = (undefined1  [8])0x0;
        info.instance = (EvallingModuleRunner *)0x0;
        pcStack_2a8 = (char *)0x0;
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_b8,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                   &keptExportsSet._M_h._M_single_bucket,
                   (pBVar41->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar53]);
        auStack_2e8 = auStack_b8;
        ::wasm::Literal::operator=((Literal *)&info,(Literal *)&size);
        originalFuncType.id =
             (uintptr_t)
             local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pLStack_308 = local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)size.value.field_0.func.super_IString.str._M_str
        ;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)size.value.type.id;
        local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_88;
        size.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        size.value.type.id = 0;
        local_88 = (pointer)0x0;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xfffffffffffffcf8
                  );
        _Stack_2b0._M_nxt = local_80;
        pcStack_2a8 = pcStack_78;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &size.value.field_0.func.super_IString.str._M_str);
        ::wasm::Literal::~Literal((Literal *)&size);
        if (pcStack_2a8 == _extendLowUToI32x4) {
          iVar58 = 8;
          if ((anonymous_namespace)::quiet == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  ...stopping due to non-constant flow\n",0x27);
          }
LAB_0012655c:
          bVar24 = false;
        }
        else {
          if (pcStack_2a8 == _replaceLaneI64x2) {
            this_02 = ::wasm::SmallVector<wasm::Literal,_1UL>::back
                                ((SmallVector<wasm::Literal,_1UL> *)auStack_2e8);
            NVar70 = ::wasm::Literal::getFunc(this_02);
            uVar22 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
            NVar74.super_IString.str._M_str = NVar70.super_IString.str._M_len;
            instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations =
                 (Index)uVar4;
            instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior =
                 SUB84(uVar4,4);
            NVar74.super_IString.str._M_len._0_4_ =
                 instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                 maxLoopIterations;
            NVar74.super_IString.str._M_len._4_4_ =
                 instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior
            ;
            instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ = uVar22;
            pFVar39 = (Function *)::wasm::Module::getFunction(NVar74);
            ::wasm::SmallVector<wasm::Literal,_1UL>::pop_back
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_2e8);
            auStack_158 = auStack_2e8;
            ::wasm::Literal::operator=((Literal *)&drop,(Literal *)&info);
            auStack_b8 = (undefined1  [8])drop.segment.super_IString.str._M_str;
            pLVar19 = local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            drop.segment.super_IString.str._M_str =
                 (char *)local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            pLStack_130 = local_2c8.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            local_128 = local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id =
                 (uintptr_t)pLVar18;
            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ = pLVar13
            ;
            local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2c8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_b8);
            if ((undefined1  [8])
                localExprs.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start != auStack_d8) {
              localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_d8;
            }
            lVar66 = ((long)pLVar19 - (long)drop.segment.super_IString.str._M_str >> 3) *
                     -0x5555555555555555 + (long)auStack_158;
            if (lVar66 != 0) {
              lVar63 = -0x18;
              lVar67 = 0;
              do {
                pDVar56 = (DataDrop *)(drop.segment.super_IString.str._M_str + lVar63);
                if (lVar67 == 0) {
                  pDVar56 = &drop;
                }
                ::wasm::Literal::Literal(&local_530,(Literal *)pDVar56);
                auStack_b8 = (undefined1  [8])
                             CtorEvalExternalInterface::getSerialization
                                       ((CtorEvalExternalInterface *)
                                        &instance.
                                         super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                                         .linkedInstances._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count,&local_530,(Name)ZEXT816(0));
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8
                           ,(Expression **)auStack_b8);
                ::wasm::Literal::~Literal(&local_530);
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x18;
              } while (lVar66 != lVar67);
            }
            CtorEvalExternalInterface::applyToModule
                      ((CtorEvalExternalInterface *)
                       &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                        .linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
            iVar58 = 5;
            goto LAB_0012655c;
          }
          if ((undefined1  [8])
              localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_d8) {
            localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_d8;
          }
          uVar65 = 0;
          while( true ) {
            uVar40 = ::wasm::Function::getNumLocals();
            if (uVar40 <= uVar65) break;
            auStack_b8 = (undefined1  [8])
                         CtorEvalExternalInterface::getSerialization
                                   ((CtorEvalExternalInterface *)
                                    &instance.
                                     super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                                     .linkedInstances._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,
                                    (Literals *)
                                    ((ulong)uVar65 * 0x38 + CONCAT71(local_390._1_7_,local_390[0])),
                                    (Name)ZEXT816(0));
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                       (Expression **)auStack_b8);
            uVar65 = uVar65 + 1;
          }
          CtorEvalExternalInterface::applyToModule
                    ((CtorEvalExternalInterface *)
                     &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                      linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
          auStack_518 = auStack_2e8;
          ::wasm::Literal::operator=((Literal *)&results,(Literal *)&info);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
                     &local_2c8);
          if (pcStack_2a8 != (char *)0x0) {
            if ((anonymous_namespace)::quiet == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  ...stopping in block due to break\n",0x24);
            }
            uVar26 = (uint)(pBVar41->list).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .usedElements;
            iVar58 = 8;
            goto LAB_0012655c;
          }
          uVar26 = uVar26 + 1;
          iVar58 = 0;
          bVar24 = true;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_2c8);
        ::wasm::Literal::~Literal((Literal *)&info);
        if (!bVar24) goto LAB_0012669b;
        uVar53 = uVar53 + 1;
      } while (uVar53 != sVar46);
      iVar58 = 8;
    }
LAB_0012669b:
    if (iVar58 == 8) {
      if ((((pFVar39->super_Importable).module.super_IString.str._M_str != (char *)0x0) ||
          ((ulong)uVar26 <
           (pBVar41->list).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements))
         && (((uVar26 != 0 ||
              ((pFVar39->super_Importable).super_Named.name.super_IString.str._M_str !=
               (char *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count)) ||
             (((undefined1  [8])
               localExprs.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start != auStack_d8 &&
              (lVar66 = ::wasm::HeapType::getSignature(), lVar66 != 0)))))) {
        sVar46 = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
        _Var23._M_pi = envInstance.
                       super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        uVar22 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
        NVar75.super_IString.str._M_str =
             (char *)envInstance.
                     super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations =
             (Index)uVar4;
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior =
             SUB84(uVar4,4);
        NVar75.super_IString.str._M_len._0_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
        NVar75.super_IString.str._M_len._4_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ = uVar22;
        lVar66 = ::wasm::Module::getFunction(NVar75);
        pLStack_308 = *(pointer *)(lVar66 + 0x38);
        root.super_IString.str._M_str = (char *)sVar46;
        root.super_IString.str._M_len = (size_t)_Var23._M_pi;
        IVar71.str = (string_view)::wasm::Names::getValidFunctionName((Module *)uVar4,root);
        uVar22 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
        NVar76.super_IString.str._M_str = (char *)type.id;
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations =
             (Index)uVar4;
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior =
             SUB84(uVar4,4);
        NVar76.super_IString.str._M_len._0_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
        NVar76.super_IString.str._M_len._4_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ = uVar22;
        lVar66 = ::wasm::Module::getExport(NVar76);
        pLVar13 = pLStack_308;
        pIVar49 = (IString *)(lVar66 + 0x18);
        if (*(char *)(lVar66 + 0x28) != '\0') {
          pIVar49 = (IString *)0x0;
        }
        pIVar49->str = IVar71.str;
        pcVar38 = (pFVar39->super_Importable).module.super_IString.str._M_str;
        if (pcVar38 == (char *)0x0) {
          auStack_2e8 = (undefined1  [8])0x0;
          info.instance = (EvallingModuleRunner *)0x0;
          info.name.super_IString.str._M_str =
               (char *)std::
                       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                       ::_M_invoke;
          info.name.super_IString.str._M_len =
               (size_t)std::
                       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                       ::_M_manager;
          pBVar42 = (Block *)::wasm::ExpressionManipulator::flexibleCopy
                                       (pFVar39->body,uVar4,auStack_2e8);
          if (info.name.super_IString.str._M_len != 0) {
            (*(code *)info.name.super_IString.str._M_len)(auStack_2e8,auStack_2e8,3);
          }
          if (pBVar42 == (Block *)0x0) {
            right = (Block *)0x0;
          }
          else {
            right = pBVar42;
            if ((pBVar42->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
                BlockId) {
              right = (Block *)0x0;
            }
          }
          if (right == (Block *)0x0) {
            right = ::wasm::Builder::makeBlock(&local_68,(Expression *)pBVar42);
          }
          if (uVar26 != 0) {
            uVar53 = 0;
            do {
              pEVar50 = (Expression *)MixedArena::allocSpace(&(local_68.wasm)->allocator,0x10,8);
              pEVar50->_id = NopId;
              (pEVar50->type).id = 0;
              if ((right->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements <= uVar53) {
LAB_001271b7:
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              (right->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
              [uVar53] = pEVar50;
              uVar53 = uVar53 + 1;
            } while (uVar26 != uVar53);
          }
          this_04 = &(local_68.wasm)->allocator;
          pEVar50 = (Expression *)MixedArena::allocSpace(this_04,0x40,8);
          pEVar50->_id = BlockId;
          (pEVar50->type).id = 0;
          *(undefined8 *)(pEVar50 + 1) = 0;
          pEVar50[1].type.id = 0;
          *(undefined8 *)(pEVar50 + 2) = 0;
          pEVar50[2].type.id = 0;
          *(undefined8 *)(pEVar50 + 3) = 0;
          pEVar50[3].type.id = (uintptr_t)this_04;
          if ((undefined1  [8])
              localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_d8) {
            uVar53 = 0;
            do {
              item = ::wasm::Builder::makeLocalSet
                               (&local_68,(Index)uVar53,*(pointer)((long)auStack_d8 + uVar53 * 8));
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pEVar50 + 2),(Expression *)item);
              uVar53 = (ulong)((Index)uVar53 + 1);
            } while (uVar53 < (ulong)((long)localExprs.
                                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                      (long)auStack_d8 >> 3));
          }
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)
               (right->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
          pBVar42 = ::wasm::Builder::makeSequence(&local_68,pEVar50,(Expression *)right,type_02);
          auStack_b8 = (undefined1  [8])0x0;
          size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
          size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
          size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
          local_330.id = ::wasm::HeapType::getSignature();
          uVar43 = ::wasm::HeapType::getSignature();
          if (local_330.id != uVar43) {
            originalParams.id = ::wasm::HeapType::getSignature();
            info.instance = (EvallingModuleRunner *)0x0;
            auStack_2e8 = (undefined1  [8])&originalParams;
            pEVar44 = (EvallingModuleRunner *)::wasm::Type::size(&originalParams);
            bVar24 = auStack_2e8 != (undefined1  [8])&originalParams;
            if (info.instance == pEVar44) goto LAB_00126ad2;
            do {
              do {
                puVar45 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_2e8);
                local_420.id = *puVar45;
                if (size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_
                    == size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type
                       .id) {
                  std::vector<wasm::Type,std::allocator<wasm::Type>>::
                  _M_realloc_insert<wasm::Type_const&>
                            ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_b8,
                             (iterator)
                             size.super_SpecificExpression<(wasm::Expression::Id)14>.
                             super_Expression._0_8_,&local_420);
                }
                else {
                  *(uintptr_t *)
                   size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
                       local_420.id;
                  size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
                       size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                       _0_8_ + 8;
                }
                info.instance =
                     (EvallingModuleRunner *)
                     ((long)&((info.instance)->
                             super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
                             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                             _vptr_ExpressionRunner + 1);
                bVar24 = auStack_2e8 != (undefined1  [8])&originalParams;
              } while (info.instance != pEVar44);
LAB_00126ad2:
            } while (bVar24);
            sVar46 = ::wasm::Type::size(&local_330);
            if (sVar46 != 0) {
              ::wasm::FindAll<wasm::LocalGet>::FindAll
                        ((FindAll<wasm::LocalGet> *)auStack_2e8,(Expression *)pBVar42);
              for (auVar51 = auStack_2e8; auVar51 != (undefined1  [8])info.instance;
                  auVar51 = (undefined1  [8])
                            &(((Function *)auVar51)->super_Importable).super_Named.name.
                             super_IString.str._M_str) {
                piVar1 = (int *)((((Function *)auVar51)->super_Importable).super_Named.name.
                                 super_IString.str._M_len + 0x10);
                *piVar1 = *piVar1 + (int)sVar46;
              }
              if (auStack_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_2e8,
                                info.name.super_IString.str._M_len - (long)auStack_2e8);
              }
              ::wasm::FindAll<wasm::LocalSet>::FindAll
                        ((FindAll<wasm::LocalSet> *)auStack_2e8,(Expression *)pBVar42);
              for (auVar51 = auStack_2e8; auVar51 != (undefined1  [8])info.instance;
                  auVar51 = (undefined1  [8])
                            &(((Function *)auVar51)->super_Importable).super_Named.name.
                             super_IString.str._M_str) {
                piVar1 = (int *)((((Function *)auVar51)->super_Importable).super_Named.name.
                                 super_IString.str._M_len + 0x10);
                *piVar1 = *piVar1 + (int)sVar46;
              }
              if (auStack_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_2e8,
                                info.name.super_IString.str._M_len - (long)auStack_2e8);
              }
            }
          }
          std::vector<wasm::Type,std::allocator<wasm::Type>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_b8,
                     size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_,
                     (pFVar39->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (pFVar39->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          name_01.super_IString.str._M_str = (char *)IVar71.str._M_len;
          name_01.super_IString.str._M_len = (size_t)auStack_2e8;
          ::wasm::Builder::makeFunction
                    (name_01,(HeapType)IVar71.str._M_str,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)pLStack_308,
                     (Expression *)auStack_b8);
          ::wasm::Module::addFunction((unique_ptr *)uVar4);
          if (auStack_2e8 != (undefined1  [8])0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)auStack_2e8,(Function *)auStack_2e8);
          }
          auStack_4d8._0_2_ = 0x100;
          auStack_4d8[2] = '\x01';
          null.field_0.i64._4_4_ = 2;
          null.field_0._8_4_ = 0xffffffff;
          null.field_0._12_4_ = 0x14;
          null.type.id._0_1_ = 0;
          local_4a0 = false;
          local_498 = false;
          vStack_4b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._4_5_ = 0;
          null.type.id._4_4_ = 0;
          vStack_4b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = false;
          vStack_4b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start._1_1_ = false;
          vStack_4b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start._2_1_ = false;
          vStack_4b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start._3_1_ = false;
          local_490._M_buckets = &local_490._M_single_bucket;
          local_490._M_bucket_count = 1;
          local_490._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_490._M_element_count = 0;
          local_490._M_rehash_policy._M_max_load_factor = 1.0;
          local_490._M_rehash_policy._M_next_resize = 0;
          local_490._M_single_bucket = (__node_base_ptr)0x0;
          local_458._M_buckets = &local_458._M_single_bucket;
          local_458._M_bucket_count = 1;
          local_458._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_458._M_element_count = 0;
          local_458._M_rehash_policy._M_max_load_factor = 1.0;
          local_458._M_rehash_policy._M_next_resize = 0;
          local_458._M_single_bucket = (__node_base_ptr)0x0;
          auStack_4d8._4_4_ = 2;
          null.field_0.i32 = 1;
          ::wasm::PassRunner::PassRunner
                    ((PassRunner *)auStack_2e8,(Module *)uVar4,(PassOptions *)auStack_4d8);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_458);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_490);
          ::wasm::PassRunner::addDefaultFunctionOptimizationPasses();
          ::wasm::PassRunner::runOnFunction((Function *)auStack_2e8);
          ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_2e8);
          if (auStack_b8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_b8,
                            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression
                            .type.id - (long)auStack_b8);
          }
        }
        else {
          auStack_2e8 = (undefined1  [8])0x0;
          info.instance = (EvallingModuleRunner *)0x0;
          info.name.super_IString.str._M_len = 0;
          sVar68 = (pFVar39->super_Importable).super_Named.name.super_IString.str;
          ::wasm::HeapType::getSignature();
          ::wasm::Builder::makeCall
                    (&local_68,(Name)sVar68,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_d8,
                     type_01,true);
          name_00.super_IString.str._M_str = (char *)IVar71.str._M_len;
          name_00.super_IString.str._M_len = (size_t)auStack_b8;
          ::wasm::Builder::makeFunction
                    (name_00,(HeapType)IVar71.str._M_str,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)pLVar13,
                     (Expression *)auStack_2e8);
          if (auStack_2e8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_2e8,
                            info.name.super_IString.str._M_len - (long)auStack_2e8);
          }
          ::wasm::Module::addFunction((unique_ptr *)uVar4);
          local_3b8 = false;
          if (auStack_b8 != (undefined1  [8])0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)auStack_b8,(Function *)auStack_b8);
          }
        }
        iVar58 = 1;
        if (pcVar38 != (char *)0x0) goto LAB_00126d43;
      }
      local_3b8 = (pBVar41->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements == (ulong)uVar26;
      if (local_3b8) {
        ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)local_3f0,
                   (SmallVector<wasm::Literal,_1UL> *)auStack_518);
      }
      iVar58 = 1;
    }
LAB_00126d43:
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    ::wasm::Literal::~Literal((Literal *)&results);
    *(uintptr_t *)(zero.value.field_0.func.super_IString.str._M_str + 0x138) = zero.value.type.id;
    *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x70) =
         *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x70) + -1;
    *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x80) =
         *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x80) + -0x10;
    std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
              ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)local_390);
  } while (iVar58 == 5);
  if (auStack_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_d8,
                    (long)localExprs.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_d8);
  }
LAB_00126dad:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &drop.segment.super_IString.str._M_str);
  ::wasm::Literal::~Literal((Literal *)&drop);
LAB_00126e07:
  if (local_3b8 == false) {
    if (((anonymous_namespace)::quiet & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...stopping\n",0xe);
    }
  }
  else {
    if (((anonymous_namespace)::quiet & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...success on ",0x10);
      poVar37 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(local_50->_M_dataplus)._M_p,
                           local_50->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar37,".\n",2);
    }
    pcVar38 = (char *)::wasm::IString::interned
                                (local_50->_M_string_length,(local_50->_M_dataplus)._M_p,0);
    NVar77.super_IString.str._M_str = pcVar38;
    NVar77.super_IString.str._M_len = (size_t)wasm;
    puVar28 = (undefined8 *)::wasm::Module::getExport(NVar77);
    cVar47 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_8e0,local_50);
    if (cVar47.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      NVar79.super_IString.str._M_str = (char *)*puVar28;
      NVar79.super_IString.str._M_len = (size_t)wasm;
      ::wasm::Module::removeExport(NVar79);
    }
    else {
      pcVar38 = (char *)0x0;
      if (*(int *)(puVar28 + 2) == 0) {
        puVar48 = puVar28 + 3;
        if (*(char *)(puVar28 + 5) != '\0') {
          puVar48 = (undefined8 *)0x0;
        }
        pcVar38 = (char *)*puVar48;
      }
      NVar78.super_IString.str._M_str = pcVar38;
      NVar78.super_IString.str._M_len = (size_t)wasm;
      pIVar49 = (IString *)::wasm::Module::getFunction(NVar78);
      IVar71.str = (string_view)::wasm::Names::getValidFunctionName(wasm,pIVar49->str);
      local_338 = '\0';
      local_398 = '\0';
      lVar66 = ::wasm::ModuleUtils::copyFunction
                         (pIVar49,wasm,IVar71.str._M_len,IVar71.str._M_str,local_350,local_3b0);
      if ((local_398 == '\x01') && (local_398 = '\0', local_3b0[0] != (void *)0x0)) {
        operator_delete(local_3b0[0],local_3a0 - (long)local_3b0[0]);
      }
      if ((local_338 == '\x01') && (local_338 = '\0', local_350[0] != (void *)0x0)) {
        operator_delete(local_350[0],local_340 - (long)local_350[0]);
      }
      ::wasm::HeapType::getSignature();
      if (extraout_RDX == 0) {
        pEVar50 = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x10,8);
        pEVar50->_id = NopId;
        (pEVar50->type).id = 0;
      }
      else {
        pEVar50 = CtorEvalExternalInterface::getSerialization
                            ((CtorEvalExternalInterface *)
                             &instance.
                              super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                              linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (Literals *)local_3f0,(Name)ZEXT816(0));
      }
      *(Expression **)(lVar66 + 0x60) = pEVar50;
      NVar80.super_IString.str._M_str = (char *)*puVar28;
      NVar80.super_IString.str._M_len = (size_t)wasm;
      lVar66 = ::wasm::Module::getExport(NVar80);
      pIVar49 = (IString *)(lVar66 + 0x18);
      if (*(char *)(lVar66 + 0x28) != '\0') {
        pIVar49 = (IString *)0x0;
      }
      pIVar49->str = IVar71.str;
    }
  }
  std::_Optional_payload_base<wasm::Literals>::_M_reset
            ((_Optional_payload_base<wasm::Literals> *)local_3f0);
  if ((local_3b8 == false) || (local_50 = local_50 + 1, local_50 == pbVar16)) goto LAB_00127050;
  goto LAB_00125de6;
}

Assistant:

void evalCtors(Module& wasm,
               std::vector<std::string>& ctors,
               std::vector<std::string>& keptExports) {
  std::unordered_set<std::string> keptExportsSet(keptExports.begin(),
                                                 keptExports.end());

  std::map<Name, std::shared_ptr<EvallingModuleRunner>> linkedInstances;

  // build and link the env module
  auto envModule = buildEnvModule(wasm);
  CtorEvalExternalInterface envInterface;
  auto envInstance =
    std::make_shared<EvallingModuleRunner>(*envModule, &envInterface);
  linkedInstances[envModule->name] = envInstance;

  CtorEvalExternalInterface interface(linkedInstances);
  try {
    // create an instance for evalling
    EvallingModuleRunner instance(wasm, &interface, linkedInstances);
    instance.instantiate();
    interface.instanceInitialized = true;
    // go one by one, in order, until we fail
    // TODO: if we knew priorities, we could reorder?
    for (auto& ctor : ctors) {
      if (!quiet) {
        std::cout << "trying to eval " << ctor << '\n';
      }
      Export* ex = wasm.getExportOrNull(ctor);
      if (!ex || ex->kind != ExternalKind::Function) {
        Fatal() << "export not found: " << ctor;
      }
      auto funcName = *ex->getInternalName();
      auto outcome = evalCtor(instance, interface, funcName, ctor);
      if (!outcome) {
        if (!quiet) {
          std::cout << "  ...stopping\n";
        }
        return;
      }

      // Success! And we can continue to try more.
      if (!quiet) {
        std::cout << "  ...success on " << ctor << ".\n";
      }

      // Remove the export if we should.
      auto* exp = wasm.getExport(ctor);
      if (!keptExportsSet.count(ctor)) {
        wasm.removeExport(exp->name);
      } else {
        // We are keeping around the export, which should now refer to an
        // empty function since calling the export should do nothing.
        auto* func = wasm.getFunction((exp->kind == ExternalKind::Function)
                                        ? *exp->getInternalName()
                                        : Name());
        auto copyName = Names::getValidFunctionName(wasm, func->name);
        auto* copyFunc = ModuleUtils::copyFunction(func, wasm, copyName);
        if (func->getResults() == Type::none) {
          copyFunc->body = Builder(wasm).makeNop();
        } else {
          copyFunc->body = interface.getSerialization(*outcome);
        }
        *wasm.getExport(exp->name)->getInternalName() = copyName;
      }
    }
  } catch (FailToEvalException& fail) {
    // that's it, we failed to even create the instance
    if (!quiet) {
      std::cout << "  ...stopping since could not create module instance: "
                << fail.why << "\n";
    }
    return;
  }
}